

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl.h
# Opt level: O0

void a__GLBlendBind(AGLBlendParams *blend)

{
  float fVar1;
  AGLBlendParams *cur;
  AGLBlendParams *blend_local;
  
  if (blend->enable != a__gl_state.blend.enable) {
    a__gl_state.blend.enable = blend->enable;
    if (blend->enable == 0) {
      glDisable(0xbe2);
    }
    else {
      glEnable(0xbe2);
    }
  }
  if (a__gl_state.blend.enable == 0) {
    return;
  }
  fVar1 = (blend->color).r;
  if ((fVar1 == a__gl_state.blend.color.r) && (!NAN(fVar1) && !NAN(a__gl_state.blend.color.r))) {
    fVar1 = (blend->color).g;
    if ((fVar1 == a__gl_state.blend.color.g) && (!NAN(fVar1) && !NAN(a__gl_state.blend.color.g))) {
      fVar1 = (blend->color).b;
      if ((fVar1 == a__gl_state.blend.color.b) && (!NAN(fVar1) && !NAN(a__gl_state.blend.color.b)))
      {
        fVar1 = (blend->color).a;
        if ((fVar1 == a__gl_state.blend.color.a) && (!NAN(fVar1) && !NAN(a__gl_state.blend.color.a))
           ) goto LAB_001049fb;
      }
    }
  }
  a__gl_state.blend.color.r = (blend->color).r;
  a__gl_state.blend.color.g = (blend->color).g;
  a__gl_state.blend.color.b = (blend->color).b;
  a__gl_state.blend.color.a = (blend->color).a;
  glBlendColor(a__gl_state.blend.color.r,a__gl_state.blend.color.g,a__gl_state.blend.color.b,
               a__gl_state.blend.color.a);
LAB_001049fb:
  if (((blend->equation).rgb != a__gl_state.blend.equation.rgb) ||
     ((blend->equation).a != a__gl_state.blend.equation.a)) {
    a__gl_state.blend.equation = blend->equation;
    if (a__gl_state.blend.equation.rgb == a__gl_state.blend.equation.a) {
      glBlendEquation(a__gl_state.blend.equation.rgb);
    }
    else {
      glBlendEquationSeparate(a__gl_state.blend.equation.rgb,a__gl_state.blend.equation.a);
    }
  }
  if (((((blend->func).src_rgb != a__gl_state.blend.func.src_rgb) ||
       ((blend->func).dst_rgb != a__gl_state.blend.func.dst_rgb)) ||
      ((blend->func).src_a != a__gl_state.blend.func.src_a)) ||
     ((blend->func).dst_a != a__gl_state.blend.func.dst_a)) {
    a__gl_state.blend.func.src_rgb = (blend->func).src_rgb;
    a__gl_state.blend.func.src_a = (blend->func).src_a;
    a__gl_state.blend.func.dst_rgb = (blend->func).dst_rgb;
    a__gl_state.blend.func.dst_a = (blend->func).dst_a;
    if ((a__gl_state.blend.func.src_rgb == a__gl_state.blend.func.src_a) &&
       (a__gl_state.blend.func.dst_rgb == a__gl_state.blend.func.dst_a)) {
      glBlendFunc(a__gl_state.blend.func.src_rgb,a__gl_state.blend.func.dst_rgb);
    }
    else {
      glBlendFuncSeparate(a__gl_state.blend.func.src_rgb,a__gl_state.blend.func.dst_rgb,
                          a__gl_state.blend.func.src_a,a__gl_state.blend.func.dst_a);
    }
  }
  return;
}

Assistant:

static void a__GLBlendBind(const AGLBlendParams *blend) {
	AGLBlendParams *cur = &a__gl_state.blend;
	if (blend->enable != cur->enable) {
		cur->enable = blend->enable;
		if (!blend->enable)
			AGL__CALL(glDisable(GL_BLEND));
		else
			AGL__CALL(glEnable(GL_BLEND));
	}

	if (!cur->enable)
		return;

	if (blend->color.r != cur->color.r || blend->color.g != cur->color.g || blend->color.b != cur->color.b ||
		blend->color.a != cur->color.a) {
		cur->color = blend->color;
		AGL__CALL(glBlendColor(cur->color.r, cur->color.g, cur->color.b, cur->color.a));
	}

	if (blend->equation.rgb != cur->equation.rgb || blend->equation.a != cur->equation.a) {
		cur->equation = blend->equation;
		if (cur->equation.rgb == cur->equation.a)
			AGL__CALL(glBlendEquation(cur->equation.rgb));
		else
			AGL__CALL(glBlendEquationSeparate(cur->equation.rgb, cur->equation.a));
	}

	if (blend->func.src_rgb != cur->func.src_rgb || blend->func.dst_rgb != cur->func.dst_rgb ||
		blend->func.src_a != cur->func.src_a || blend->func.dst_a != cur->func.dst_a) {
		cur->func = blend->func;
		if (cur->func.src_rgb == cur->func.src_a && cur->func.dst_rgb == cur->func.dst_a)
			AGL__CALL(glBlendFunc(cur->func.src_rgb, cur->func.dst_rgb));
		else
			AGL__CALL(glBlendFuncSeparate(cur->func.src_rgb, cur->func.dst_rgb, cur->func.src_a, cur->func.dst_a));
	}
}